

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int SaveMultiChannelEXRToFile(EXRImage *exrImage,char *filename,char **err)

{
  FILE *__stream;
  undefined8 *in_RDX;
  char *in_RSI;
  long in_RDI;
  size_t mem_size;
  uchar *mem;
  FILE *fp;
  char **in_stack_00000578;
  uchar **in_stack_00000580;
  EXRImage *in_stack_00000588;
  int local_4;
  
  if ((in_RDI == 0) || (in_RSI == (char *)0x0)) {
    if (in_RDX != (undefined8 *)0x0) {
      *in_RDX = "Invalid argument.";
    }
    local_4 = -1;
  }
  else {
    __stream = fopen(in_RSI,"wb");
    if (__stream == (FILE *)0x0) {
      if (in_RDX != (undefined8 *)0x0) {
        *in_RDX = "Cannot write a file.";
      }
      local_4 = -1;
    }
    else {
      SaveMultiChannelEXRToMemory(in_stack_00000588,in_stack_00000580,in_stack_00000578);
      free((void *)0x0);
      fclose(__stream);
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int SaveMultiChannelEXRToFile(const EXRImage *exrImage, const char *filename,
                              const char **err) {
  if (exrImage == NULL || filename == NULL) {
    if (err) {
      (*err) = "Invalid argument.";
    }
    return -1;
  }

  FILE *fp = fopen(filename, "wb");
  if (!fp) {
    if (err) {
      (*err) = "Cannot write a file.";
    }
    return -1;
  }

  unsigned char *mem = NULL;
  size_t mem_size = SaveMultiChannelEXRToMemory(exrImage, &mem, err);

  if ((mem_size > 0) && mem) {

    fwrite(mem, 1, mem_size, fp);
  }
  free(mem);

  fclose(fp);

  return 0; // OK
}